

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

void __thiscall TaprootBuilder::Insert(TaprootBuilder *this,NodeInfo *node,int depth)

{
  vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  *this_00;
  ulong uVar1;
  pointer poVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  NodeInfo local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0x80 < (uint)depth) {
    __assert_fail("depth >= 0 && (size_t)depth <= TAPROOT_CONTROL_MAX_NODE_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                  ,0x13f,"void TaprootBuilder::Insert(TaprootBuilder::NodeInfo &&, int)");
  }
  if ((ulong)(depth + 1) <
      (ulong)((long)(this->m_branch).
                    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_branch).
                    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6)) {
    this->m_valid = false;
  }
  else {
    this_00 = &this->m_branch;
    uVar4 = (ulong)(uint)depth;
    lVar5 = uVar4 << 0x20;
    lVar3 = uVar4 << 6;
    while (this->m_valid == true) {
      poVar2 = (this->m_branch).
               super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = (long)(this->m_branch).
                    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)poVar2 >> 6;
      if ((uVar1 <= uVar4) ||
         (*(char *)((long)&(poVar2->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                           _M_payload.
                           super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false> +
                   lVar3 + 0x38) != '\x01')) {
        uVar4 = lVar5 >> 0x20;
        if (uVar1 <= uVar4) {
          std::
          vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
          ::resize(this_00,uVar4 + 1);
          poVar2 = (this_00->
                   super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
        if (*(bool *)((long)&poVar2[uVar4].
                             super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>._M_payload
                             .super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>
                     + 0x38) == true) {
          __assert_fail("!m_branch[depth].has_value()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                        ,0x152,"void TaprootBuilder::Insert(TaprootBuilder::NodeInfo &&, int)");
        }
        std::optional<TaprootBuilder::NodeInfo>::operator=(poVar2 + uVar4,node);
        break;
      }
      Combine(&local_70,node,
              (NodeInfo *)
              ((long)&(poVar2->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                      _M_payload.
                      super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false> + lVar3)
             );
      NodeInfo::operator=(node,&local_70);
      std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::~vector
                (&local_70.leaves);
      std::
      vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ::pop_back(this_00);
      bVar6 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if (bVar6) {
        this->m_valid = false;
      }
      lVar5 = lVar5 + -0x100000000;
      lVar3 = lVar3 + -0x40;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TaprootBuilder::Insert(TaprootBuilder::NodeInfo&& node, int depth)
{
    assert(depth >= 0 && (size_t)depth <= TAPROOT_CONTROL_MAX_NODE_COUNT);
    /* We cannot insert a leaf at a lower depth while a deeper branch is unfinished. Doing
     * so would mean the Add() invocations do not correspond to a DFS traversal of a
     * binary tree. */
    if ((size_t)depth + 1 < m_branch.size()) {
        m_valid = false;
        return;
    }
    /* As long as an entry in the branch exists at the specified depth, combine it and propagate up.
     * The 'node' variable is overwritten here with the newly combined node. */
    while (m_valid && m_branch.size() > (size_t)depth && m_branch[depth].has_value()) {
        node = Combine(std::move(node), std::move(*m_branch[depth]));
        m_branch.pop_back();
        if (depth == 0) m_valid = false; /* Can't propagate further up than the root */
        --depth;
    }
    if (m_valid) {
        /* Make sure the branch is big enough to place the new node. */
        if (m_branch.size() <= (size_t)depth) m_branch.resize((size_t)depth + 1);
        assert(!m_branch[depth].has_value());
        m_branch[depth] = std::move(node);
    }
}